

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O1

void __thiscall
Clique::translate(Clique *this,size_t *translation_table,size_t table_size,size_t new_capacity)

{
  ulong *puVar1;
  pointer puVar2;
  alignment_set_t *paVar3;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar4;
  allocator<unsigned_long> local_29;
  
  this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x20);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (this_00,new_capacity,0,&local_29);
  if (table_size != 0) {
    puVar2 = (this->alignment_set->m_bits).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if ((puVar2[translation_table[uVar4] >> 6] >> (translation_table[uVar4] & 0x3f) & 1) != 0) {
        puVar1 = (this_00->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start + (uVar4 >> 6);
        *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      }
      uVar4 = uVar4 + 1;
    } while (table_size != uVar4);
  }
  paVar3 = this->alignment_set;
  if (paVar3 != (alignment_set_t *)0x0) {
    puVar2 = (paVar3->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    operator_delete(paVar3);
  }
  this->alignment_set = this_00;
  return;
}

Assistant:

void Clique::translate(size_t* translation_table, size_t table_size, size_t new_capacity) {
	alignment_set_t* new_alignment_set = new alignment_set_t(new_capacity);
	for (size_t i=0; i<table_size; ++i) {
		if (alignment_set->test(translation_table[i])) {
			new_alignment_set->set(i,true);
		}
	}
	delete alignment_set;
	alignment_set = new_alignment_set;
}